

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.c
# Opt level: O0

void pnga_patch_enum(Integer g_a,Integer lo,Integer hi,void *start,void *stride)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Integer IVar7;
  long lVar8;
  long lVar9;
  double *in_RCX;
  long in_RDX;
  long in_RSI;
  Integer in_RDI;
  double *in_R8;
  DoubleComplex offset_6;
  DoubleComplex astride_6;
  DoubleComplex astart_6;
  DoubleComplex *aptr_6;
  SingleComplex offset_5;
  SingleComplex astride_5;
  SingleComplex astart_5;
  SingleComplex *aptr_5;
  double offset_4;
  double astride_4;
  double astart_4;
  double *aptr_4;
  char *in_stack_00000088;
  float offset_3;
  float astride_3;
  float astart_3;
  float *aptr_3;
  longlong offset_2;
  longlong astride_2;
  longlong astart_2;
  longlong *aptr_2;
  long offset_1;
  long astride_1;
  long astart_1;
  long *aptr_1;
  int offset;
  int astride;
  int astart;
  int *aptr;
  Integer nelem;
  Integer i;
  Integer ld;
  void *ptr;
  Integer off;
  Integer me;
  Integer type;
  Integer ndim;
  Integer hip;
  Integer lop;
  Integer dims [1];
  Integer *in_stack_00000198;
  Integer *in_stack_000001a0;
  Integer in_stack_000001a8;
  Integer in_stack_000001b0;
  Integer *in_stack_00000270;
  void *in_stack_00000278;
  Integer *in_stack_00000280;
  Integer *in_stack_00000288;
  Integer in_stack_00000290;
  float local_128;
  float fStack_124;
  float local_120;
  float fStack_11c;
  long local_78;
  long local_68;
  undefined8 local_50;
  long local_40;
  long local_38 [2];
  double *local_28;
  double *local_20;
  long local_18;
  long local_10;
  Integer local_8;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  pnga_sync();
  pnga_nodeid();
  pnga_check_handle(_astride_3,in_stack_00000088);
  IVar7 = pnga_ndim((Integer)aptr_4);
  if (1 < IVar7) {
    pnga_error((char *)astart_6.real,(Integer)astride_6.imag);
  }
  pnga_inquire(astart_2,(Integer *)astride_2,(Integer *)offset_2,(Integer *)aptr_3);
  pnga_distribution(in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,in_stack_00000198);
  if (((0 < local_38[0]) && (local_38[0] <= local_18)) && (local_10 <= local_40)) {
    if (local_38[0] < local_10) {
      local_38[0] = local_10;
    }
    if (local_18 < local_40) {
      local_40 = local_18;
    }
    lVar8 = (local_40 - local_38[0]) + 1;
    lVar9 = local_38[0] - local_10;
    pnga_access_ptr(in_stack_00000290,in_stack_00000288,in_stack_00000280,in_stack_00000278,
                    in_stack_00000270);
    switch(local_50) {
    case 0x3e9:
      fVar1 = *(float *)local_20;
      fVar2 = *(float *)local_28;
      for (local_78 = 0; local_78 < lVar8; local_78 = local_78 + 1) {
        *(int *)(local_68 + local_78 * 4) = (int)fVar1 + ((int)lVar9 + (int)local_78) * (int)fVar2;
      }
      break;
    case 0x3ea:
      dVar3 = *local_20;
      dVar4 = *local_28;
      for (local_78 = 0; local_78 < lVar8; local_78 = local_78 + 1) {
        *(long *)(local_68 + local_78 * 8) = (long)dVar3 + (lVar9 + local_78) * (long)dVar4;
      }
      break;
    case 0x3eb:
      fVar1 = *(float *)local_20;
      fVar2 = *(float *)local_28;
      for (local_78 = 0; local_78 < lVar8; local_78 = local_78 + 1) {
        *(float *)(local_68 + local_78 * 4) = fVar1 + (float)(lVar9 + local_78) * fVar2;
      }
      break;
    case 0x3ec:
      dVar3 = *local_20;
      dVar4 = *local_28;
      for (local_78 = 0; local_78 < lVar8; local_78 = local_78 + 1) {
        *(double *)(local_68 + local_78 * 8) = dVar3 + (double)(lVar9 + local_78) * dVar4;
      }
      break;
    default:
      pnga_error((char *)astart_6.real,(Integer)astride_6.imag);
      break;
    case 0x3ee:
      dVar3 = *local_20;
      dVar4 = *local_28;
      for (local_78 = 0; local_78 < lVar8; local_78 = local_78 + 1) {
        local_128 = SUB84(dVar4,0);
        fStack_124 = (float)((ulong)dVar4 >> 0x20);
        local_120 = SUB84(dVar3,0);
        *(float *)(local_68 + local_78 * 8) = local_120 + (float)(lVar9 + local_78) * local_128;
        fStack_11c = (float)((ulong)dVar3 >> 0x20);
        *(float *)(local_68 + 4 + local_78 * 8) =
             fStack_11c + (float)(lVar9 + local_78) * fStack_124;
      }
      break;
    case 0x3ef:
      dVar3 = *local_20;
      dVar4 = local_20[1];
      dVar5 = *local_28;
      dVar6 = local_28[1];
      for (local_78 = 0; local_78 < lVar8; local_78 = local_78 + 1) {
        *(double *)(local_68 + local_78 * 0x10) = dVar3 + (double)(lVar9 + local_78) * dVar5;
        *(double *)(local_68 + local_78 * 0x10 + 8) = dVar4 + (double)(lVar9 + local_78) * dVar6;
      }
      break;
    case 0x3f8:
      dVar3 = *local_20;
      dVar4 = *local_28;
      for (local_78 = 0; local_78 < lVar8; local_78 = local_78 + 1) {
        *(long *)(local_68 + local_78 * 8) = (long)dVar3 + (lVar9 + local_78) * (long)dVar4;
      }
    }
    pnga_release_update(local_8,local_38,&local_40);
  }
  pnga_sync();
  return;
}

Assistant:

void pnga_patch_enum(Integer g_a, Integer lo, Integer hi, void* start, void* stride)
{
Integer dims[1],lop,hip;
Integer ndim, type, me, off;

   pnga_sync();
   me = pnga_nodeid();

   pnga_check_handle(g_a, "ga_patch_enum");

   ndim = pnga_ndim(g_a);
   if (ndim > 1) pnga_error("ga_patch_enum:applicable to 1-dim arrays",ndim);

   pnga_inquire(g_a, &type, &ndim, dims);
   pnga_distribution(g_a, me, &lop, &hip);

   if ( lop > 0 ){ /* we get 0 if no elements stored on this process */

      /* take product of patch owned and specified by the user */ 
      if(hi <lop || hip <lo); /* we got no elements to update */
      else{
        void *ptr;
        Integer ld;
        register Integer i;
        register Integer nelem;

        if(lop < lo)lop = lo;
        if(hip > hi)hip = hi;
        nelem = hip-lop+1;
        off = lop - lo;
        pnga_access_ptr(g_a, &lop, &hip, &ptr, &ld);
        
        switch (type) {
#define TYPE_CASE(MT,T,AT)                                                  \
            case MT:                                                        \
                {                                                           \
                    T *aptr = (T*)ptr;                                      \
                    T astart = *((T*)start);                                \
                    T astride = *((T*)stride);                              \
                    for (i=0; i<nelem; i++) {                               \
                        T offset;                                           \
                        assign_mul_constant_##AT(offset,off+i,astride);     \
                        assign_add_##AT(aptr[i],astart,offset);             \
                    }                                                       \
                    break;                                                  \
                }
#include "types.xh"
#undef TYPE_CASE
            default: pnga_error("ga_patch_enum:wrong data type ",type);
        }

        pnga_release_update(g_a, &lop, &hip);
      }
   }
   
   pnga_sync();
}